

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

void __thiscall
immutable::ref<immutable::rrb<int,_false,_5>_>::~ref(ref<immutable::rrb<int,_false,_5>_> *this)

{
  rrb_details::release<int,5>(this->ptr);
  return;
}

Assistant:

ref<T>::~ref()
      {
      rrb_details::release(ptr);
      }